

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options_serializer_boost_po.h
# Opt level: O0

bool __thiscall
VW::config::options_serializer_boost_po::serialize_if_t<double>
          (options_serializer_boost_po *this,base_option *base_option)

{
  type_info *ptVar1;
  options_serializer_boost_po *this_00;
  long in_RSI;
  typed_option<double> typed;
  typed_option<double> *typed_option;
  type_info *this_01;
  typed_option<double> local_b8;
  long local_18;
  byte local_1;
  
  this_01 = *(type_info **)(in_RSI + 0x28);
  local_18 = in_RSI;
  ptVar1 = (type_info *)std::type_info::hash_code(this_01);
  if (this_01 == ptVar1) {
    this_00 = (options_serializer_boost_po *)
              __dynamic_cast(local_18,&config::base_option::typeinfo,&typed_option<double>::typeinfo
                             ,0);
    if (this_00 == (options_serializer_boost_po *)0x0) {
      __cxa_bad_cast();
    }
    typed_option = &local_b8;
    typed_option<double>::typed_option((typed_option<double> *)this_00,typed_option);
    serialize<double>(this_00,typed_option);
    local_1 = 1;
    typed_option<double>::~typed_option((typed_option<double> *)this_00);
  }
  else {
    local_1 = 0;
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool serialize_if_t(base_option& base_option)
  {
    if (base_option.m_type_hash == typeid(T).hash_code())
    {
      auto typed = dynamic_cast<typed_option<T>&>(base_option);
      serialize(typed);
      return true;
    }

    return false;
  }